

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_PerObjectMeshParameters *
ON_PerObjectMeshParameters::FindOrCreate(ON_Object *object,bool bCreate)

{
  ON_UserData *p;
  ON_PerObjectMeshParameters *this;
  ON_UUID local_28;
  
  if (object == (ON_Object *)0x0) {
    this = (ON_PerObjectMeshParameters *)0x0;
  }
  else {
    local_28 = ON_ClassId::Uuid(&m_ON_PerObjectMeshParameters_class_rtti);
    p = ON_Object::GetUserData(object,&local_28);
    this = Cast(&p->super_ON_Object);
    if (bCreate && this == (ON_PerObjectMeshParameters *)0x0) {
      this = (ON_PerObjectMeshParameters *)operator_new(0x1a8);
      ON_PerObjectMeshParameters(this);
      ON_Object::AttachUserData(object,(ON_UserData *)this);
    }
  }
  return this;
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}